

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O3

void __thiscall flow::diagnostics::ConsoleReport::push_back(ConsoleReport *this,Message *message)

{
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  long *local_268;
  long local_260;
  long local_258 [2];
  Message *local_248;
  code *local_240;
  undefined **local_238;
  undefined1 *local_230;
  long local_228;
  ulong local_220;
  undefined1 local_218 [504];
  
  local_248 = message;
  if (message->type == Warning) {
    local_240 = fmt::v5::internal::
                value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ::format_custom_arg<flow::diagnostics::Message>;
    local_228 = 0;
    local_238 = &PTR_grow_001ade08;
    local_220 = 500;
    format_str.size_ = 0xc;
    format_str.data_ = "Warning: {}\n";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_248;
    args.types_ = 0xd;
    local_230 = local_218;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_238,format_str,args);
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,local_230,local_230 + local_228);
    local_238 = &PTR_grow_001ade08;
    if (local_230 != local_218) {
      operator_delete(local_230,local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)local_268,local_260);
  }
  else {
    this->errorCount_ = this->errorCount_ + 1;
    local_240 = fmt::v5::internal::
                value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ::format_custom_arg<flow::diagnostics::Message>;
    local_228 = 0;
    local_238 = &PTR_grow_001ade08;
    local_220 = 500;
    format_str_00.size_ = 10;
    format_str_00.data_ = "Error: {}\n";
    args_00.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_248;
    args_00.types_ = 0xd;
    local_230 = local_218;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_238,format_str_00,args_00);
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,local_230,local_230 + local_228);
    local_238 = &PTR_grow_001ade08;
    if (local_230 != local_218) {
      operator_delete(local_230,local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)local_268,local_260);
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  return;
}

Assistant:

void ConsoleReport::push_back(Message message) {
  if (message.type != Type::Warning)
    errorCount_++;

  switch (message.type) {
    case Type::Warning:
      std::cerr << fmt::format("Warning: {}\n", message);
      break;
    default:
      std::cerr << fmt::format("Error: {}\n", message);
      break;
  }
}